

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall
DomLayoutDefault::read(DomLayoutDefault *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_00;
  long lVar3;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar4;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_00 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  lVar3 = 0;
  pQVar4 = local_50.ptr;
  while( true ) {
    if (local_50.size * 0x68 == lVar3) break;
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"spacing",7);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_80.ptr = *(char16_t **)(local_50.ptr + lVar3 + 0x50);
      local_80.d = *(Data **)(local_50.ptr + lVar3 + 0x58);
      iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
      this->m_attr_spacing = iVar2;
      this->m_has_attr_spacing = true;
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"margin",6);
      local_98.a.m_size = local_80.size;
      local_98.a.m_data = (char *)local_80.ptr;
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (bVar1) {
        local_80.ptr = *(char16_t **)(local_50.ptr + lVar3 + 0x50);
        local_80.d = *(Data **)(local_50.ptr + lVar3 + 0x58);
        iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
        this->m_attr_margin = iVar2;
        this->m_has_attr_margin = true;
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)this_00);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
    }
    pQVar4 = pQVar4 + 0x68;
    lVar3 = lVar3 + 0x68;
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_00);
      if (bVar1) goto LAB_0014cdf5;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      local_98.a.m_size = 0x13;
      local_98.a.m_data = "Unexpected element ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
  } while (iVar2 != 5);
LAB_0014cdf5:
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutDefault::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"spacing"_s) {
            setAttributeSpacing(attribute.value().toInt());
            continue;
        }
        if (name == u"margin"_s) {
            setAttributeMargin(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}